

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<unsigned_int> __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_int>::tryAllocate
          (HoleSet<unsigned_int> *this,uint lgSize)

{
  size_t sVar1;
  NullableValue<unsigned_int> *other;
  uint *puVar2;
  anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2 in_EDX;
  undefined4 in_register_00000034;
  uint (*arr) [6];
  uint local_40 [2];
  uint result_1;
  undefined1 local_30 [8];
  NullableValue<unsigned_int> local_28;
  NullableValue<unsigned_int> next;
  uint result;
  uint lgSize_local;
  HoleSet<unsigned_int> *this_local;
  
  arr = (uint (*) [6])CONCAT44(in_register_00000034,lgSize);
  next.field_1 = in_EDX;
  sVar1 = kj::size<unsigned_int,6ul>(arr);
  if (in_EDX.value < sVar1) {
    if ((*arr)[next.field_1.value] == 0) {
      tryAllocate((HoleSet<unsigned_int> *)local_30,lgSize);
      other = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)local_30);
      kj::_::NullableValue<unsigned_int>::NullableValue
                ((NullableValue<unsigned_int> *)(local_30 + 8),other);
      kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_30);
      puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)(local_30 + 8))
      ;
      if (puVar2 == (uint *)0x0) {
        kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(void *)0x0);
      }
      else {
        puVar2 = kj::_::NullableValue<unsigned_int>::operator*
                           ((NullableValue<unsigned_int> *)(local_30 + 8));
        local_40[0] = *puVar2 * 2;
        (*arr)[next.field_1.value] = local_40[0] + 1;
        kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,local_40);
      }
      kj::_::NullableValue<unsigned_int>::~NullableValue
                ((NullableValue<unsigned_int> *)(local_30 + 8));
    }
    else {
      next._0_4_ = (*arr)[next.field_1.value];
      (*arr)[next.field_1.value] = 0;
      kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(uint *)&next);
    }
  }
  else {
    kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(void *)0x0);
  }
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

kj::Maybe<UIntType> tryAllocate(UIntType lgSize) {
      // Try to find space for a field of size 2^lgSize within the set of holes.  If found,
      // remove it from the holes, and return its offset (as a multiple of its size).  If there
      // is no such space, returns zero (no hole can be at offset zero, as explained above).

      if (lgSize >= kj::size(holes)) {
        return nullptr;
      } else if (holes[lgSize] != 0) {
        UIntType result = holes[lgSize];
        holes[lgSize] = 0;
        return result;
      } else {
        KJ_IF_MAYBE(next, tryAllocate(lgSize + 1)) {
          UIntType result = *next * 2;
          holes[lgSize] = result + 1;
          return result;
        } else {
          return nullptr;
        }
      }
    }